

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::on_string
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info,string_t *str)

{
  bool bVar1;
  undefined8 uVar2;
  parser_info_t<cfgfile::qstring_trait_t> *in_RSI;
  tag_t<cfgfile::qstring_trait_t> *in_RDI;
  QString value;
  string_t *in_stack_fffffffffffffd70;
  parser_info_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffd78;
  string_t *what;
  tag_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffd80;
  exception_t<cfgfile::qstring_trait_t> *this_00;
  string *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  string_t local_1e1 [2];
  exception_t<cfgfile::qstring_trait_t> local_1a1 [10];
  parser_info_t<cfgfile::qstring_trait_t> *local_10;
  
  local_10 = in_RSI;
  bVar1 = tag_t<cfgfile::qstring_trait_t>::is_any_child_defined(in_stack_fffffffffffffd80);
  if (!bVar1) {
    format_t<QString,_cfgfile::qstring_trait_t>::from_string
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    QString::append((QString *)(in_RDI + 1));
    tag_t<cfgfile::qstring_trait_t>::set_defined(in_RDI,true);
    QString::~QString((QString *)0x14678d);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,(allocator<char> *)in_RDI);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffda8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffda8,(qstring_wrapper_t *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,(allocator<char> *)in_RDI);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffda8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffda8,(qstring_wrapper_t *)in_RDI);
  tag_t<cfgfile::qstring_trait_t>::name(in_RDI);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffda8,(qstring_wrapper_t *)in_RDI);
  this_00 = local_1a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,(allocator<char> *)in_RDI);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffda8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffda8,(qstring_wrapper_t *)in_RDI);
  parser_info_t<cfgfile::qstring_trait_t>::file_name(local_10);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffda8,(qstring_wrapper_t *)in_RDI);
  what = local_1e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,(allocator<char> *)in_RDI);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffda8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffda8,(qstring_wrapper_t *)in_RDI);
  parser_info_t<cfgfile::qstring_trait_t>::line_number(local_10);
  qstring_trait_t::to_string((pos_t)in_stack_fffffffffffffda8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffda8,(qstring_wrapper_t *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,(allocator<char> *)in_RDI);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffda8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffda8,(qstring_wrapper_t *)in_RDI);
  exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,what);
  __cxa_throw(uVar2,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( this->is_any_child_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Value \"" ) + str +
				Trait::from_ascii( "\" for tag \"" ) + this->name() +
				Trait::from_ascii( "\" must be defined before any "
					"child tag. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		const QString value = format_t< QString, Trait >::from_string( info, str );

		m_value.append( value );

		this->set_defined();
	}